

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O3

void __thiscall libtorrent::aux::resolver::resolver(resolver *this,io_context *ios)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_resolver_interface)._vptr_resolver_interface =
       (_func_int **)&PTR_async_resolve_004e2ef8;
  (this->m_cache)._M_h._M_buckets = &(this->m_cache)._M_h._M_single_bucket;
  (this->m_cache)._M_h._M_bucket_count = 1;
  (this->m_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_cache)._M_h._M_element_count = 0;
  (this->m_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_failed_cache)._M_h._M_buckets = &(this->m_failed_cache)._M_h._M_single_bucket;
  (this->m_failed_cache)._M_h._M_bucket_count = 1;
  (this->m_failed_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_failed_cache)._M_h._M_element_count = 0;
  (this->m_failed_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_failed_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_failed_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_ios = ios;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&(this->m_resolver).impl_,ios,(type *)0x0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&(this->m_critical_resolver).impl_,ios,(type *)0x0);
  this->m_max_size = 700;
  (this->m_timeout).__r = 1200000000000;
  p_Var1 = &(this->m_callbacks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_callbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_callbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_callbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_callbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_callbacks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

resolver::resolver(io_context& ios)
		: m_ios(ios)
		, m_resolver(ios)
		, m_critical_resolver(ios)
		, m_max_size(700)
		, m_timeout(seconds(1200))
	{}